

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::info_based_rephase(Solver *this)

{
  char cVar1;
  longlong lVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  byte *pbVar6;
  size_type sVar7;
  reference pvVar8;
  longlong *plVar9;
  uint *puVar10;
  Solver *in_RDI;
  int i_1;
  int i;
  int var_nums;
  long local_28;
  double in_stack_ffffffffffffffe0;
  int v;
  int index;
  
  iVar4 = nVars((Solver *)0x138558);
  for (index = 0; index < iVar4; index = index + 1) {
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                       (&in_RDI->ls_mediation_soln,(long)index);
    cVar1 = *pvVar5;
    pbVar6 = (byte *)vec<char>::operator[](&in_RDI->polarity,index);
    *pbVar6 = (cVar1 != '\0' ^ 0xffU) & 1;
  }
  bVar3 = considersDISTANCE(in_RDI);
  if (((!bVar3) &&
      (sVar7 = std::vector<int,_std::allocator<int>_>::size(&(in_RDI->ccnr).conflict_ct), sVar7 != 0
      )) && (0 < (in_RDI->ccnr)._step)) {
    for (v = 0; v < iVar4; v = v + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(in_RDI->ccnr).conflict_ct,(long)(v + 1));
      if (0 < *pvVar8) {
        bVar3 = usesVSIDS(in_RDI);
        if (bVar3) {
          std::vector<int,_std::allocator<int>_>::operator[]
                    (&(in_RDI->ccnr).conflict_ct,(long)(v + 1));
          varBumpActivity((Solver *)CONCAT44(iVar4,index),v,in_stack_ffffffffffffffe0);
        }
        else {
          in_stack_ffffffffffffffe0 = 4.94065645841247e-324;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(in_RDI->ccnr).conflict_ct,(long)(v + 1));
          local_28 = (long)(*pvVar8 * 100) / (in_RDI->ccnr)._step;
          plVar9 = std::max<long_long>((longlong *)&stack0xffffffffffffffe0,&local_28);
          lVar2 = *plVar9;
          puVar10 = vec<unsigned_int>::operator[](&in_RDI->conflicted,v);
          *puVar10 = *puVar10 + (int)lVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void Solver::info_based_rephase()
{
    int var_nums = nVars();
    for (int i = 0; i < var_nums; ++i) polarity[i] = !ls_mediation_soln[i];
    if (!considersDISTANCE() && ccnr.conflict_ct.size() > 0 && ccnr._step > 0) {
        for (int i = 0; i < var_nums; ++i) {
            if (ccnr.conflict_ct[i + 1] > 0) {
                if (usesVSIDS()) {
                    varBumpActivity(i, ccnr.conflict_ct[i + 1] * 100 / ccnr._step);
                } else {
                    conflicted[i] += std::max((long long int)1, ccnr.conflict_ct[i + 1] * 100 / ccnr._step);
                }
            }
        }
    }
}